

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.h
# Opt level: O2

string * __thiscall
ctemplate::TemplateDictionary::PrintableTemplateString_abi_cxx11_
          (string *__return_storage_ptr__,TemplateDictionary *this,TemplateString *ts)

{
  _func_int **pp_Var1;
  UnsafeArena *pUVar2;
  
  pp_Var1 = (this->super_TemplateDictionaryInterface)._vptr_TemplateDictionaryInterface;
  pUVar2 = this->arena_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pp_Var1,
             (long)pp_Var1 + (long)((pUVar2->super_BaseArena).first_blocks_ + -5) + 8);
  return __return_storage_ptr__;
}

Assistant:

static std::string PrintableTemplateString(
      const TemplateString& ts) {
    return std::string(ts.data(), ts.size());
  }